

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_dpps_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t mask)

{
  float32 fVar1;
  float32 local_48;
  float32 local_44;
  float32 local_40;
  float32 local_3c;
  float32 local_28;
  float32 iresult;
  uint32_t mask_local;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  local_28 = 0;
  if ((mask & 0x10) != 0) {
    fVar1 = float32_mul_x86_64(d->_s_ZMMReg[0],s->_s_ZMMReg[0],&env->sse_status);
    local_28 = float32_add_x86_64(0,fVar1,&env->sse_status);
  }
  if ((mask & 0x20) != 0) {
    fVar1 = float32_mul_x86_64(d->_s_ZMMReg[1],s->_s_ZMMReg[1],&env->sse_status);
    local_28 = float32_add_x86_64(local_28,fVar1,&env->sse_status);
  }
  if ((mask & 0x40) != 0) {
    fVar1 = float32_mul_x86_64(d->_s_ZMMReg[2],s->_s_ZMMReg[2],&env->sse_status);
    local_28 = float32_add_x86_64(local_28,fVar1,&env->sse_status);
  }
  if ((mask & 0x80) != 0) {
    fVar1 = float32_mul_x86_64(d->_s_ZMMReg[3],s->_s_ZMMReg[3],&env->sse_status);
    local_28 = float32_add_x86_64(local_28,fVar1,&env->sse_status);
  }
  if ((mask & 1) == 0) {
    local_3c = 0;
  }
  else {
    local_3c = local_28;
  }
  d->_s_ZMMReg[0] = local_3c;
  if ((mask & 2) == 0) {
    local_40 = 0;
  }
  else {
    local_40 = local_28;
  }
  d->_s_ZMMReg[1] = local_40;
  if ((mask & 4) == 0) {
    local_44 = 0;
  }
  else {
    local_44 = local_28;
  }
  d->_s_ZMMReg[2] = local_44;
  if ((mask & 8) == 0) {
    local_48 = 0;
  }
  else {
    local_48 = local_28;
  }
  d->_s_ZMMReg[3] = local_48;
  return;
}

Assistant:

void glue(helper_dpps, SUFFIX)(CPUX86State *env, Reg *d, Reg *s, uint32_t mask)
{
    float32 iresult = float32_zero;

    if (mask & (1 << 4)) {
        iresult = float32_add(iresult,
                              float32_mul(d->ZMM_S(0), s->ZMM_S(0),
                                          &env->sse_status),
                              &env->sse_status);
    }
    if (mask & (1 << 5)) {
        iresult = float32_add(iresult,
                              float32_mul(d->ZMM_S(1), s->ZMM_S(1),
                                          &env->sse_status),
                              &env->sse_status);
    }
    if (mask & (1 << 6)) {
        iresult = float32_add(iresult,
                              float32_mul(d->ZMM_S(2), s->ZMM_S(2),
                                          &env->sse_status),
                              &env->sse_status);
    }
    if (mask & (1 << 7)) {
        iresult = float32_add(iresult,
                              float32_mul(d->ZMM_S(3), s->ZMM_S(3),
                                          &env->sse_status),
                              &env->sse_status);
    }
    d->ZMM_S(0) = (mask & (1 << 0)) ? iresult : float32_zero;
    d->ZMM_S(1) = (mask & (1 << 1)) ? iresult : float32_zero;
    d->ZMM_S(2) = (mask & (1 << 2)) ? iresult : float32_zero;
    d->ZMM_S(3) = (mask & (1 << 3)) ? iresult : float32_zero;
}